

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

void __thiscall irr::core::string<char>::reallocate(string<char> *this,s32 new_size)

{
  char *pcVar1;
  char *pcVar2;
  int local_34;
  int local_28;
  s32 i;
  s32 amount;
  char *old_array;
  s32 new_size_local;
  string<char> *this_local;
  
  pcVar1 = this->array;
  pcVar2 = (char *)operator_new__((long)new_size);
  this->array = pcVar2;
  this->allocated = new_size;
  local_34 = new_size;
  if (this->used < new_size) {
    local_34 = this->used;
  }
  for (local_28 = 0; local_28 < local_34; local_28 = local_28 + 1) {
    this->array[local_28] = pcVar1[local_28];
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  return;
}

Assistant:

void reallocate(s32 new_size)
	{
		T* old_array = array;

		array = new T[new_size];
		allocated = new_size;
		
		s32 amount = used < new_size ? used : new_size;
		for (s32 i=0; i<amount; ++i)
			array[i] = old_array[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_array;
	}